

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_png_to_func
              (stbi_write_func *func,void *context,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *__ptr;
  undefined8 in_RSI;
  code *in_RDI;
  uchar *png;
  int len;
  int in_stack_00000040;
  int in_stack_00000044;
  uchar *in_stack_00000048;
  undefined4 local_34;
  undefined4 local_4;
  
  __ptr = stbi_write_png_to_mem
                    (in_stack_00000048,in_stack_00000044,in_stack_00000040,func._4_4_,(int)func,
                     (int *)context);
  if (__ptr != (uchar *)0x0) {
    (*in_RDI)(in_RSI,__ptr,local_34);
    free(__ptr);
  }
  local_4 = (uint)(__ptr != (uchar *)0x0);
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_png_to_func(stbi_write_func *func, void *context, int x, int y, int comp, const void *data, int stride_bytes)
{
   int len;
   unsigned char *png = stbi_write_png_to_mem((const unsigned char *) data, stride_bytes, x, y, comp, &len);
   if (png == NULL) return 0;
   func(context, png, len);
   STBIW_FREE(png);
   return 1;
}